

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

void DeviceZxSpectrumNext(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *device;
  char *pcVar1;
  
  if (ramtop != 0) {
    WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
  }
  if (Options::IsI8080 == '\x01') {
    Error("Can\'t use ZXN device while in i8080 assembling mode",line,FATAL);
  }
  if (Options::IsLR35902 == '\x01') {
    Error("Can\'t use ZXN device while in Sharp LR35902 assembling mode",line,FATAL);
  }
  device = (CDevice *)operator_new(0x2838);
  device->Next = (CDevice *)0x0;
  device->SlotsCount = 0;
  device->PagesCount = 0;
  device->Memory = (byte *)0x0;
  device->ZxRamTop = 0;
  device->CurrentSlot = 0;
  device->previousSlotI = 0;
  device->previousSlotOpt = O_NONE;
  device->limitExceeded = false;
  pcVar1 = strdup("ZXSPECTRUMNEXT");
  device->ID = pcVar1;
  if (parent != (CDevice *)0x0) {
    parent->Next = device;
  }
  memset(device->Slots,0,0x2800);
  *dev = device;
  initRegularSlotDevice(device,0x2000,8,0xe0,(int *)&DAT_00160610);
  if (DAT_0018e51c != 0) {
    return;
  }
  DAT_0018e51c = 1;
  Z80::InitNextExtensions();
  return;
}

Assistant:

static void DeviceZxSpectrumNext(CDevice **dev, CDevice *parent, aint ramtop) {
	if (ramtop) WarningById(W_NO_RAMTOP);
	if (Options::IsI8080) Error("Can't use ZXN device while in i8080 assembling mode", line, FATAL);
	if (Options::IsLR35902) Error("Can't use ZXN device while in Sharp LR35902 assembling mode", line, FATAL);
	*dev = new CDevice("ZXSPECTRUMNEXT", parent);
	const int initialPages[] = {14, 15, 10, 11, 4, 5, 0, 1};	// basically same as ZX128, but 8k
	initRegularSlotDevice(*dev, 0x2000, 8, 224, initialPages);
	// auto-enable ZX Next instruction extensions
	if (0 == Options::syx.IsNextEnabled) {
		Options::syx.IsNextEnabled = 1;
		Z80::InitNextExtensions();		// add the special opcodes here (they were not added)
				// this is a bit late, but it should work as well as `--zxnext` option I believe
	}
}